

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall
chrono::ChArchiveAsciiDump::out_array_end(ChArchiveAsciiDump *this,ChValue *bVal,size_t msize)

{
  undefined1 *puVar1;
  int iVar2;
  
  iVar2 = *(int *)&(this->super_ChArchiveOut).field_0x104;
  *(int *)&(this->super_ChArchiveOut).field_0x104 = iVar2 + -1;
  if (1 < iVar2) {
    iVar2 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"] \n");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  return;
}

Assistant:

virtual void out_array_end (ChValue& bVal, size_t msize) {
            --tablevel;
            indent();
            (*ostream) << "] \n";
            --tablevel;
      }